

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void DefineStyleRules(TidyDocImpl *doc,Node *node)

{
  Node *local_20;
  Node *child;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if (node->content != (Node *)0x0) {
    for (local_20 = node->content; local_20 != (Node *)0x0; local_20 = local_20->next) {
      DefineStyleRules(doc,local_20);
    }
  }
  Style2Rule(doc,node);
  return;
}

Assistant:

static void DefineStyleRules( TidyDocImpl* doc, Node *node )
{
    Node *child;

    if (node->content)
    {
        for (child = node->content;
                child != NULL; child = child->next)
        {
            DefineStyleRules( doc, child );
        }
    }

    Style2Rule( doc, node );
}